

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

int __thiscall Fl_Text_Buffer::word_start(Fl_Text_Buffer *this,int pos)

{
  uint uVar1;
  int iVar2;
  
  if (0 < pos) {
    do {
      uVar1 = char_at(this,pos);
      iVar2 = isalnum(uVar1);
      if (iVar2 == 0) {
        uVar1 = char_at(this,pos);
        if (uVar1 != 0x5f) break;
      }
      pos = prev_char_clipped(this,pos);
    } while (pos != 0);
  }
  uVar1 = char_at(this,pos);
  iVar2 = isalnum(uVar1);
  if (iVar2 == 0) {
    uVar1 = char_at(this,pos);
    if (uVar1 != 0x5f) {
      iVar2 = next_char(this,pos);
      return iVar2;
    }
  }
  return pos;
}

Assistant:

int Fl_Text_Buffer::word_start(int pos) const {
  // FIXME: character is ucs-4
  while (pos>0 && (isalnum(char_at(pos)) || char_at(pos) == '_')) {
    pos = prev_char(pos);
  } 
  // FIXME: character is ucs-4
  if (!(isalnum(char_at(pos)) || char_at(pos) == '_'))
    pos = next_char(pos);
  return pos;
}